

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int check_extant(lws_dll2 *d,void *user)

{
  int iVar1;
  int iVar2;
  
  iVar1 = lws_vhost_compare_listen((lws_vhost *)d[-0x1b].owner,*(lws_vhost **)((long)user + 8));
  iVar2 = 0;
  if ((iVar1 != 0) && (*(uint *)((long)user + 0x10) == (uint)*(byte *)((long)&d[0x15].owner + 7))) {
    _lws_log(4," using listen skt from vhost %s\n",d[-0x1b].owner[0x16].tail);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
check_extant(struct lws_dll2 *d, void *user)
{
	struct lws *wsi = lws_container_of(d, struct lws, listen_list);
	struct vh_sock_args *a = (struct vh_sock_args *)user;

	if (!lws_vhost_compare_listen(wsi->a.vhost, a->vhost))
		return 0;

	if (wsi->af != a ->af)
		return 0;

	lwsl_notice(" using listen skt from vhost %s\n", wsi->a.vhost->name);

	return 1;
}